

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

Fad<double> * __thiscall
TPZMatrix<Fad<double>_>::MatrixNorm
          (Fad<double> *__return_storage_ptr__,TPZMatrix<Fad<double>_> *this,int p,int64_t numiter,
          REAL tol)

{
  Fad<double> *pFVar1;
  long lVar2;
  _func_int **pp_Var3;
  bool bVar4;
  ostream *poVar5;
  ulong *puVar6;
  double *pdVar7;
  ulong uVar8;
  Fad<double> *pFVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  Fad<double> sum;
  TPZVec<Fad<double>_> EigenVal;
  TPZFMatrix<Fad<double>_> transp;
  TPZVec<Fad<double>_> ROW;
  double local_180;
  undefined1 local_168 [8];
  undefined1 local_160 [16];
  double *pdStack_150;
  double local_148;
  long local_140;
  REAL local_138;
  int64_t local_130;
  _func_int **local_128;
  TPZVec<Fad<double>_> local_120;
  TPZFMatrix<Fad<double>_> local_100;
  TPZVec<Fad<double>_> local_70;
  Fad<double> local_50;
  
  lVar14 = (this->super_TPZBaseMatrix).fRow;
  if (lVar14 != 0) {
    local_138 = tol;
    local_130 = numiter;
    if (lVar14 != (this->super_TPZBaseMatrix).fCol) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
                 ,0x53);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," - matrix must be square - Rows() = ",0x24);
      poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," - Cols() = ",0xc);
      poVar5 = std::ostream::_M_insert<long>((long)poVar5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    if (p == 2) {
      local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
           = (_func_int **)&PTR__TPZFMatrix_0181eb60;
      local_100.fElem = (Fad<double> *)0x0;
      local_100.fGiven = (Fad<double> *)0x0;
      local_100.fSize = 0;
      local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow = lVar14;
      local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol = lVar14;
      TPZVec<int>::TPZVec(&local_100.fPivot.super_TPZVec<int>,0);
      local_100.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_100.fPivot.super_TPZVec<int>.fStore = local_100.fPivot.fExtAlloc;
      local_100.fPivot.super_TPZVec<int>.fNElements = 0;
      local_100.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_128 = (_func_int **)&PTR__TPZVec_0181ee50;
      local_100.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0181ee50;
      local_100.fWork.fStore = (Fad<double> *)0x0;
      local_100.fWork.fNElements = 0;
      local_100.fWork.fNAlloc = 0;
      uVar8 = lVar14 * lVar14;
      puVar6 = (ulong *)operator_new__(-(ulong)(uVar8 >> 0x3b != 0) | uVar8 * 0x20 | 8);
      *puVar6 = uVar8;
      pFVar1 = (Fad<double> *)(puVar6 + 1);
      lVar12 = 0;
      pFVar9 = pFVar1;
      do {
        Fad<double>::Fad(pFVar9);
        lVar12 = lVar12 + -0x20;
        pFVar9 = pFVar9 + 1;
      } while (-lVar12 != uVar8 * 0x20);
      local_100.fElem = pFVar1;
      if (0 < lVar14) {
        lVar12 = 0;
        do {
          lVar15 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      ((Fad<double> *)local_168,this,lVar15,lVar12);
            pFVar1 = local_100.fElem;
            if ((local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= lVar12) ||
               (local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar15)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar15;
            local_100.fElem[lVar10 + lVar12].val_ = (double)local_168;
            Vector<double>::operator=
                      (&local_100.fElem[lVar10 + lVar12].dx_,(Vector<double> *)local_160);
            pFVar1[lVar10 + lVar12].defaultVal = (double)pdStack_150;
            Fad<double>::~Fad((Fad<double> *)local_168);
            lVar15 = lVar15 + 1;
          } while (lVar14 != lVar15);
          lVar12 = lVar12 + 1;
        } while (lVar12 != lVar14);
      }
      TPZVec<Fad<double>_>::TPZVec(&local_70,lVar14);
      if (0 < lVar14) {
        lVar12 = 0;
        do {
          lVar10 = 0;
          lVar15 = 0;
          local_140 = lVar12;
          do {
            pFVar9 = local_70.fStore;
            pFVar1 = local_100.fElem;
            if ((local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar15)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar15;
            pdVar7 = (double *)((long)&(local_70.fStore)->val_ + lVar10);
            *pdVar7 = local_100.fElem[lVar11 + lVar12].val_;
            Vector<double>::operator=
                      ((Vector<double> *)(pdVar7 + 1),&local_100.fElem[lVar11 + lVar12].dx_);
            *(double *)((long)&pFVar9->defaultVal + lVar10) = pFVar1[lVar11 + lVar12].defaultVal;
            lVar15 = lVar15 + 1;
            lVar10 = lVar10 + 0x20;
          } while (lVar14 != lVar15);
          lVar15 = 0;
          do {
            local_168 = (undefined1  [8])0x0;
            local_160._0_4_ = 0;
            local_160._8_8_ = (double *)0x0;
            pdStack_150 = (double *)0x0;
            lVar10 = 0;
            lVar11 = 0;
            do {
              pFVar1 = local_70.fStore;
              (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                        (&local_50,this,lVar11,lVar15);
              local_120._vptr_TPZVec = (_func_int **)((long)&pFVar1->val_ + lVar10);
              local_120.fStore = &local_50;
              Fad<double>::operator+=
                        ((Fad<double> *)local_168,
                         (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)&local_120);
              Fad<double>::~Fad(&local_50);
              pFVar1 = local_100.fElem;
              lVar2 = local_140;
              lVar11 = lVar11 + 1;
              lVar10 = lVar10 + 0x20;
            } while (lVar14 != lVar11);
            if ((local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow <= local_140) ||
               (local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fCol <= lVar15)) {
              TPZFMatrix<Fad<double>_>::Error
                        ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar10 = local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow * lVar15;
            local_100.fElem[lVar10 + lVar12].val_ = (double)local_168;
            Vector<double>::operator=
                      (&local_100.fElem[lVar10 + lVar12].dx_,(Vector<double> *)local_160);
            pFVar1[lVar10 + lVar12].defaultVal = (double)pdStack_150;
            Fad<double>::~Fad((Fad<double> *)local_168);
            lVar15 = lVar15 + 1;
          } while (lVar15 != lVar14);
          lVar12 = lVar2 + 1;
        } while (lVar12 != lVar14);
      }
      pp_Var3 = local_128;
      local_120._vptr_TPZVec = local_128;
      local_120.fStore = (Fad<double> *)0x0;
      local_120.fNElements = 0;
      local_120.fNAlloc = 0;
      bVar4 = SolveEigenvaluesJacobi
                        (&local_100.super_TPZMatrix<Fad<double>_>,&local_130,&local_138,&local_120);
      if (!bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
                   ,0x53);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," - it was not possible to find Eigenvalues. Iterations = "
                   ,0x39);
        poVar5 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," - error found = ",0x11);
        poVar5 = std::ostream::_M_insert<double>(local_138);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
      }
      FadFuncSqrt<Fad<double>_>::FadFuncSqrt
                ((FadFuncSqrt<Fad<double>_> *)&local_50,local_120.fStore);
      FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
                ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_168,
                 (FadFuncSqrt<Fad<double>_> *)&local_50);
      Fad<double>::~Fad(&local_50);
      dVar16 = (double)CONCAT44(local_160._4_4_,local_160._0_4_);
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
      }
      else {
        dVar16 = SQRT(dVar16);
      }
      __return_storage_ptr__->val_ = dVar16;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
      if ((long)(int)local_160._8_4_ < 1) {
        __return_storage_ptr__->defaultVal = 0.0;
      }
      else {
        (__return_storage_ptr__->dx_).num_elts = local_160._8_4_;
        uVar8 = (long)(int)local_160._8_4_ * 8;
        pdVar7 = (double *)operator_new__(uVar8);
        (__return_storage_ptr__->dx_).ptr_to_data = pdVar7;
        __return_storage_ptr__->defaultVal = 0.0;
        uVar13 = 0;
        do {
          pdVar7 = (double *)((long)pdStack_150 + uVar13);
          if (local_160._8_4_ == 0) {
            pdVar7 = &local_148;
          }
          dVar16 = *pdVar7;
          dVar17 = (double)CONCAT44(local_160._4_4_,local_160._0_4_);
          if (dVar17 < 0.0) {
            dVar17 = sqrt(dVar17);
          }
          else {
            dVar17 = SQRT(dVar17);
          }
          *(double *)((long)(__return_storage_ptr__->dx_).ptr_to_data + uVar13) =
               dVar16 / (dVar17 + dVar17);
          uVar13 = uVar13 + 8;
        } while (uVar8 != uVar13);
      }
      Fad<double>::~Fad((Fad<double> *)local_160);
      pFVar1 = local_120.fStore;
      local_120._vptr_TPZVec = pp_Var3;
      if (local_120.fStore != (Fad<double> *)0x0) {
        pFVar9 = local_120.fStore + -1;
        dVar16 = local_120.fStore[-1].defaultVal;
        if (dVar16 != 0.0) {
          lVar14 = (long)dVar16 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&pFVar1[-1].val_ + lVar14));
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != 0);
        }
        operator_delete__(&pFVar9->defaultVal,(long)dVar16 << 5 | 8);
      }
      local_70._vptr_TPZVec = pp_Var3;
      if (local_70.fStore != (Fad<double> *)0x0) {
        dVar16 = local_70.fStore[-1].defaultVal;
        if (dVar16 != 0.0) {
          lVar14 = (long)dVar16 << 5;
          do {
            Fad<double>::~Fad((Fad<double> *)((long)&local_70.fStore[-1].val_ + lVar14));
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != 0);
        }
        operator_delete__(&local_70.fStore[-1].defaultVal,(long)dVar16 << 5 | 8);
      }
      TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_100);
      return __return_storage_ptr__;
    }
    if (p == 1) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar14 < 1) {
        return __return_storage_ptr__;
      }
      lVar12 = 0;
      do {
        local_180 = 0.0;
        lVar15 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_100,this,lVar15,lVar12);
          local_180 = local_180 +
                      ABS((double)local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
                                  super_TPZSavable._vptr_TPZSavable);
          Fad<double>::~Fad((Fad<double> *)&local_100);
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
        if ((ABS(__return_storage_ptr__->val_) < local_180) &&
           (__return_storage_ptr__->val_ = local_180, (__return_storage_ptr__->dx_).num_elts != 0))
        {
          local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable = (_func_int **)0x0;
          Vector<double>::operator=(&__return_storage_ptr__->dx_,(double *)&local_100);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar14);
      return __return_storage_ptr__;
    }
    if (p == 0) {
      __return_storage_ptr__->val_ = 0.0;
      (__return_storage_ptr__->dx_).num_elts = 0;
      (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
      __return_storage_ptr__->defaultVal = 0.0;
      if (lVar14 < 1) {
        return __return_storage_ptr__;
      }
      lVar12 = 0;
      do {
        local_180 = 0.0;
        lVar15 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                    (&local_100,this,lVar12,lVar15);
          local_180 = local_180 +
                      ABS((double)local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
                                  super_TPZSavable._vptr_TPZSavable);
          Fad<double>::~Fad((Fad<double> *)&local_100);
          lVar15 = lVar15 + 1;
        } while (lVar14 != lVar15);
        if ((ABS(__return_storage_ptr__->val_) < local_180) &&
           (__return_storage_ptr__->val_ = local_180, (__return_storage_ptr__->dx_).num_elts != 0))
        {
          local_100.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable = (_func_int **)0x0;
          Vector<double>::operator=(&__return_storage_ptr__->dx_,(double *)&local_100);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar14);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "TVar TPZMatrix<Fad<double>>::MatrixNorm(int, int64_t, REAL) const [T = Fad<double>]"
               ,0x53);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," p = ",5);
    poVar5 = (ostream *)std::ostream::operator<<(&std::cerr,p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," is not a correct option",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  __return_storage_ptr__->val_ = 0.0;
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  __return_storage_ptr__->defaultVal = 0.0;
  return __return_storage_ptr__;
}

Assistant:

TVar TPZMatrix<TVar>::MatrixNorm(int p, int64_t numiter, REAL tol) const{
	const int64_t n = this->Rows();
	if (!n) return 0.;
	if (n != this->Cols()){
		PZError << __PRETTY_FUNCTION__
		<< " - matrix must be square - Rows() = "
		<< this->Rows() << " - Cols() = "
		<< this->Cols() << std::endl;
	}
	switch(p){
		case 0:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(i,j) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 1:{
			TVar max = 0.;
			int64_t i, j;
			for(i = 0; i < n; i++){
				REAL sum = 0.;
				for(j = 0; j < n; j++) sum += fabs( this->Get(j,i) );
				if (sum > fabs(max)) max = sum;
			}
			return max;
		}
		case 2:{
			TPZFMatrix<TVar> transp(n,n);
			int64_t i, j, k;
			//TRANSPOSE
			for(i = 0; i < n; i++) for(j = 0; j < n; j++) transp(i,j) = this->Get(j,i);
			//MULTIPLY transp = transp.this
			TPZVec<TVar> ROW(n);
			for(i = 0; i < n; i++){
				for(j = 0; j < n; j++) ROW[j] = transp(i,j);
				for(j = 0; j < n; j++){
					TVar sum = 0.;
					for(k = 0; k < n; k++){
						sum += ROW[k] * this->Get(k,j);
					}//for k
					transp(i,j) = sum;
				}//for j
			}//for i
			
			TPZVec<TVar> EigenVal;
			bool result = transp.SolveEigenvaluesJacobi(numiter, tol, &EigenVal);
			if (result == false) PZError << __PRETTY_FUNCTION__
				<< " - it was not possible to find Eigenvalues. Iterations = "
				<< numiter << " - error found = " << tol << std::endl;
			return sqrt(EigenVal[0]);
		}//case 2
		default:{
			PZError << __PRETTY_FUNCTION__ << " p = " << p << " is not a correct option" << std::endl;
		}
	}//switch
	return 0.;
}